

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunnonlinsol_fixedpoint.c
# Opt level: O0

int SUNNonlinSolSetMaxIters_FixedPoint(SUNNonlinearSolver NLS,int maxiters)

{
  int maxiters_local;
  SUNNonlinearSolver NLS_local;
  int local_4;
  
  if (NLS == (SUNNonlinearSolver)0x0) {
    local_4 = -0x385;
  }
  else if (maxiters < 1) {
    local_4 = -0x387;
  }
  else {
    *(int *)((long)NLS->content + 0x94) = maxiters;
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int SUNNonlinSolSetMaxIters_FixedPoint(SUNNonlinearSolver NLS, int maxiters)
{
  /* check that the nonlinear solver is non-null */
  if (NLS == NULL)
    return(SUN_NLS_MEM_NULL);

  /* check that maxiters is a vaild */
  if (maxiters < 1)
    return(SUN_NLS_ILL_INPUT);

  FP_CONTENT(NLS)->maxiters = maxiters;
  return(SUN_NLS_SUCCESS);
}